

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RollupOutput::PrintTreeToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  RollupRow *pRVar4;
  bool bVar5;
  size_type sVar6;
  bool bVar7;
  const_iterator __begin2;
  RollupRow *row_00;
  int iVar8;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  allocator<char> local_b1;
  undefined4 local_b0;
  int local_ac;
  RollupOutput *local_a8;
  ostream *local_a0;
  RollupRow *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar8 = (int)CONCAT71(in_register_00000081,tabs);
  local_a8 = this;
  local_a0 = out;
  if (iVar8 == 0) {
    pcVar2 = (row->name)._M_dataplus._M_p;
    sVar3 = (row->name)._M_string_length;
    bVar7 = false;
    for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = pcVar2[sVar6];
      bVar5 = true;
      if ((cVar1 != '\"') && (cVar1 != ',')) {
        bVar5 = bVar7;
      }
      bVar7 = bVar5;
      if ((cVar1 == '\"') || (cVar1 == ',')) break;
    }
    local_ac = iVar8;
    local_70._M_len = sVar3;
    local_70._M_str = pcVar2;
    if (bVar7) {
      local_b0 = (undefined4)CONCAT71(in_register_00000089,csvDiff);
      local_98 = row;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\"",&local_b1);
      for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
        if (pcVar2[sVar6] == '\"') {
          std::__cxx11::string::append((char *)&local_90);
        }
        else {
          std::__cxx11::string::push_back((char)&local_90);
        }
      }
      std::__cxx11::string::append((char *)&local_90);
      csvDiff = SUB41(local_b0,0);
      row = local_98;
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_90,&local_70,&local_b1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_90);
    tabs = SUB41(local_ac,0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(parent_labels,&row->name);
  }
  row_00 = (row->sorted_children).
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar4 = (row->sorted_children).
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar4 == row_00) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,parent_labels);
    PrintRowToCSV(local_a8,row,&local_60,local_a0,tabs,csvDiff);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  }
  else {
    for (; row_00 != pRVar4; row_00 = row_00 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,parent_labels);
      PrintTreeToCSV(local_a8,row_00,&local_48,local_a0,tabs,csvDiff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  return;
}

Assistant:

void RollupOutput::PrintTreeToCSV(const RollupRow& row,
                                  std::vector<std::string> parent_labels,
                                  std::ostream* out, bool tabs, bool csvDiff) const {
  if (tabs) {
    parent_labels.push_back(row.name);
  } else {
    parent_labels.push_back(CSVEscape(row.name));
  }

  if (row.sorted_children.size() > 0) {
    for (const auto& child_row : row.sorted_children) {
      PrintTreeToCSV(child_row, parent_labels, out, tabs, csvDiff);
    }
  } else {
    PrintRowToCSV(row, parent_labels, out, tabs, csvDiff);
  }
}